

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialAnalyzer.cpp
# Opt level: O3

void __thiscall
OpenMD::SequentialAnalyzer::SequentialAnalyzer
          (SequentialAnalyzer *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  string *script;
  SelectionEvaluator *this_00;
  SelectionEvaluator *this_01;
  pointer pcVar1;
  long lVar2;
  SelectionSet local_68;
  SelectionManager *local_50;
  string *local_48;
  SelectionManager *local_40;
  string *local_38;
  
  this->_vptr_SequentialAnalyzer = (_func_int **)&PTR__SequentialAnalyzer_0024daf0;
  this->info_ = info;
  this->currentSnapshot_ = (Snapshot *)0x0;
  (this->dumpFilename_)._M_dataplus._M_p = (pointer)&(this->dumpFilename_).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->dumpFilename_,pcVar1,pcVar1 + filename->_M_string_length);
  local_40 = &this->seleMan1_;
  local_38 = &this->dumpFilename_;
  SelectionManager::SelectionManager(local_40,info);
  script = &this->selectionScript1_;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)&(this->selectionScript1_).field_2;
  pcVar1 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)script,pcVar1,pcVar1 + sele1->_M_string_length);
  this_00 = &this->evaluator1_;
  local_48 = script;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_50 = &this->seleMan2_;
  SelectionManager::SelectionManager(local_50,info);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  pcVar1 = (sele2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript2_,pcVar1,pcVar1 + sele2->_M_string_length);
  this_01 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  this->step_ = 1;
  (this->outputFilename_)._M_dataplus._M_p = (pointer)&(this->outputFilename_).field_2;
  (this->outputFilename_)._M_string_length = 0;
  (this->outputFilename_).field_2._M_local_buf[0] = '\0';
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sequenceType_)._M_dataplus._M_p = (pointer)&(this->sequenceType_).field_2;
  (this->sequenceType_)._M_string_length = 0;
  (this->sequenceType_).field_2._M_local_buf[0] = '\0';
  (this->paramString_)._M_dataplus._M_p = (pointer)&(this->paramString_).field_2;
  (this->paramString_)._M_string_length = 0;
  (this->paramString_).field_2._M_local_buf[0] = '\0';
  SelectionEvaluator::loadScriptString(this_00,script);
  SelectionEvaluator::loadScriptString(this_01,&this->selectionScript2_);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_68,this_00);
    lVar2 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar2),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_68.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar2));
      lVar2 = lVar2 + 0x28;
    } while (lVar2 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_68.bitsets_);
  }
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_68,this_01);
    lVar2 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar2),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_68.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar2));
      lVar2 = lVar2 + 0x28;
    } while (lVar2 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_68.bitsets_);
  }
  return;
}

Assistant:

SequentialAnalyzer::SequentialAnalyzer(SimInfo* info,
                                         const std::string& filename,
                                         const std::string& sele1,
                                         const std::string& sele2) :
      info_(info),
      currentSnapshot_(NULL), dumpFilename_(filename), seleMan1_(info),
      selectionScript1_(sele1), evaluator1_(info), seleMan2_(info),
      selectionScript2_(sele2), evaluator2_(info), step_(1) {
    paramString_.clear();

    evaluator1_.loadScriptString(selectionScript1_);
    evaluator2_.loadScriptString(selectionScript2_);

    // if selections are static, we only need to evaluate them once
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }
  }